

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O3

QSize __thiscall
QPixmapStyle::sizeFromContents
          (QPixmapStyle *this,ContentsType type,QStyleOption *option,QSize *contentsSize,
          QWidget *widget)

{
  QSize QVar1;
  
  switch(type >> 1 | (uint)((type & CT_CheckBox) != CT_PushButton) << 0x1f) {
  case CT_PushButton:
    QVar1 = pushButtonSizeFromContents(this,option,contentsSize,widget);
    return QVar1;
  case CT_CheckBox:
  case CT_ComboBox:
  case CT_Splitter:
  case CT_MenuBarItem:
  case CT_MenuBar:
  case CT_Menu:
    QVar1 = QCommonStyle::sizeFromContents
                      (&this->super_QCommonStyle,type,option,contentsSize,widget);
    return QVar1;
  case CT_RadioButton:
    QVar1 = comboBoxSizeFromContents(this,option,contentsSize,widget);
    return QVar1;
  case CT_ToolButton:
    QVar1 = progressBarSizeFromContents(this,option,contentsSize,widget);
    return QVar1;
  case CT_ProgressBar:
    QVar1 = sliderSizeFromContents(this,option,contentsSize,widget);
    return QVar1;
  case CT_MenuItem:
    QVar1 = lineEditSizeFromContents(this,option,contentsSize,(QWidget *)contentsSize);
    return QVar1;
  case CT_TabBarTab:
    QVar1 = itemViewSizeFromContents(this,option,contentsSize,widget);
    return QVar1;
  default:
    QVar1 = QCommonStyle::sizeFromContents
                      (&this->super_QCommonStyle,type,option,contentsSize,widget);
    return QVar1;
  }
}

Assistant:

QSize QPixmapStyle::sizeFromContents(ContentsType type, const QStyleOption *option,
                                     const QSize &contentsSize, const QWidget *widget) const
{
    switch (type) {
    case CT_PushButton:
        return pushButtonSizeFromContents(option, contentsSize, widget);
    case CT_LineEdit:
        return lineEditSizeFromContents(option, contentsSize, widget);
    case CT_ProgressBar:
        return progressBarSizeFromContents(option, contentsSize, widget);
    case CT_Slider:
        return sliderSizeFromContents(option, contentsSize, widget);
    case CT_ComboBox:
        return comboBoxSizeFromContents(option, contentsSize, widget);
    case CT_ItemViewItem:
        return itemViewSizeFromContents(option, contentsSize, widget);
    default: ;
    }

    return QCommonStyle::sizeFromContents(type, option, contentsSize, widget);
}